

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O3

REF_STATUS
ref_split_edge_tri_conformity
          (REF_BOOL verbose,REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT new_node,
          REF_BOOL *allowed)

{
  REF_INT cell;
  REF_NODE ref_node;
  REF_GEOM ref_geom;
  REF_CELL pRVar1;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  uint uVar4;
  int iVar5;
  REF_INT RVar6;
  long lVar7;
  undefined8 uVar8;
  int iVar9;
  char *pcVar10;
  int iVar11;
  REF_DBL uv_area;
  REF_DBL uv_area0;
  REF_DBL sign_uv_area;
  REF_DBL normdev1;
  REF_DBL uv_area1;
  REF_DBL normdev0;
  REF_DBL normdev;
  REF_INT nodes [27];
  long local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  long local_c0;
  double local_b8;
  double local_b0;
  REF_INT local_a8 [30];
  
  ref_node = ref_grid->node;
  ref_geom = ref_grid->geom;
  *allowed = 0;
  if ((0 < ref_geom->n) && (-1 < node0)) {
    pRVar1 = ref_grid->cell[3];
    pRVar2 = pRVar1->ref_adj;
    if ((node0 < pRVar2->nnode) && (local_f0 = (long)pRVar2->first[(uint)node0], local_f0 != -1)) {
      pRVar3 = pRVar2->item + local_f0;
      RVar6 = pRVar1->node_per;
      while( true ) {
        if (0 < RVar6) {
          iVar9 = pRVar3->ref;
          iVar11 = 0;
          do {
            if (pRVar1->c2n[pRVar1->size_per * iVar9 + iVar11] == node1) {
              uVar4 = ref_cell_nodes(pRVar1,iVar9,local_a8);
              if (uVar4 != 0) {
                pcVar10 = "cell nodes";
                uVar8 = 0x301;
                goto LAB_001fd245;
              }
              uVar4 = ref_geom_tri_norm_deviation(ref_grid,local_a8,&local_b0);
              if (uVar4 != 0) {
                pcVar10 = "nd";
                uVar8 = 0x302;
                goto LAB_001fd245;
              }
              iVar5 = pRVar1->node_per;
              if (0 < iVar5) {
                lVar7 = 0;
                do {
                  if (local_a8[lVar7] == node0) {
                    local_a8[lVar7] = new_node;
                    iVar5 = pRVar1->node_per;
                  }
                  lVar7 = lVar7 + 1;
                } while (lVar7 < iVar5);
              }
              uVar4 = ref_geom_tri_norm_deviation(ref_grid,local_a8,&local_b8);
              if (uVar4 != 0) {
                pcVar10 = "nd0";
                uVar8 = 0x306;
                goto LAB_001fd245;
              }
              iVar5 = pRVar1->node_per;
              if (0 < iVar5) {
                lVar7 = 0;
                do {
                  if (local_a8[lVar7] == new_node) {
                    local_a8[lVar7] = node0;
                    iVar5 = pRVar1->node_per;
                  }
                  lVar7 = lVar7 + 1;
                } while (lVar7 < iVar5);
                if (0 < iVar5) {
                  lVar7 = 0;
                  do {
                    if (local_a8[lVar7] == node1) {
                      local_a8[lVar7] = new_node;
                      iVar5 = pRVar1->node_per;
                    }
                    lVar7 = lVar7 + 1;
                  } while (lVar7 < iVar5);
                }
              }
              uVar4 = ref_geom_tri_norm_deviation(ref_grid,local_a8,&local_d0);
              if (uVar4 != 0) {
                pcVar10 = "nd1";
                uVar8 = 0x30d;
                goto LAB_001fd245;
              }
              if (((local_b8 <= local_b0) && (local_b8 < ref_grid->adapt->post_min_normdev)) ||
                 ((local_d0 <= local_b0 && (local_d0 < ref_grid->adapt->post_min_normdev)))) {
                if (verbose != 0) {
                  printf("nd %f %f %f\n",local_b0,local_b8,local_d0);
                }
                *allowed = 0;
                return 0;
              }
            }
            iVar11 = iVar11 + 1;
            RVar6 = pRVar1->node_per;
          } while (iVar11 < RVar6);
        }
        pRVar3 = pRVar1->ref_adj->item;
        local_f0 = (long)pRVar3[(int)local_f0].next;
        if (local_f0 == -1) break;
        pRVar3 = pRVar3 + local_f0;
      }
      if (ref_geom->n < 1) goto LAB_001fd29a;
    }
    if ((ref_geom->meshlink == (void *)0x0) && (-1 < node0)) {
      pRVar1 = ref_grid->cell[3];
      pRVar2 = pRVar1->ref_adj;
      if ((node0 < pRVar2->nnode) && (local_c0 = (long)pRVar2->first[(uint)node0], local_c0 != -1))
      {
        pRVar3 = pRVar2->item + local_c0;
        RVar6 = pRVar1->node_per;
        do {
          if (0 < RVar6) {
            cell = pRVar3->ref;
            iVar9 = 0;
            do {
              if (pRVar1->c2n[pRVar1->size_per * cell + iVar9] == node1) {
                uVar4 = ref_cell_nodes(pRVar1,cell,local_a8);
                if (uVar4 != 0) {
                  pcVar10 = "cell nodes";
                  uVar8 = 0x31d;
LAB_001fd245:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                         ,uVar8,"ref_split_edge_tri_conformity",(ulong)uVar4,pcVar10);
                  return uVar4;
                }
                uVar4 = ref_geom_uv_area(ref_geom,local_a8,&local_e8);
                if (uVar4 != 0) {
                  pcVar10 = "uv area";
                  uVar8 = 0x31e;
                  goto LAB_001fd245;
                }
                uVar4 = ref_geom_uv_area_sign(ref_grid,local_a8[3],&local_d8);
                if (uVar4 != 0) {
                  pcVar10 = "sign";
                  uVar8 = 799;
                  goto LAB_001fd245;
                }
                local_e8 = local_d8 * local_e8;
                iVar11 = pRVar1->node_per;
                if (0 < iVar11) {
                  lVar7 = 0;
                  do {
                    if (local_a8[lVar7] == node0) {
                      local_a8[lVar7] = new_node;
                      iVar11 = pRVar1->node_per;
                    }
                    lVar7 = lVar7 + 1;
                  } while (lVar7 < iVar11);
                }
                uVar4 = ref_geom_uv_area(ref_geom,local_a8,&local_e0);
                if (uVar4 != 0) {
                  pcVar10 = "uv area";
                  uVar8 = 0x324;
                  goto LAB_001fd245;
                }
                uVar4 = ref_geom_uv_area_sign(ref_grid,local_a8[3],&local_d8);
                if (uVar4 != 0) {
                  pcVar10 = "sign";
                  uVar8 = 0x325;
                  goto LAB_001fd245;
                }
                local_e0 = local_d8 * local_e0;
                iVar11 = pRVar1->node_per;
                if (0 < iVar11) {
                  lVar7 = 0;
                  do {
                    if (local_a8[lVar7] == new_node) {
                      local_a8[lVar7] = node0;
                      iVar11 = pRVar1->node_per;
                    }
                    lVar7 = lVar7 + 1;
                  } while (lVar7 < iVar11);
                  if (0 < iVar11) {
                    lVar7 = 0;
                    do {
                      if (local_a8[lVar7] == node1) {
                        local_a8[lVar7] = new_node;
                        iVar11 = pRVar1->node_per;
                      }
                      lVar7 = lVar7 + 1;
                    } while (lVar7 < iVar11);
                  }
                }
                uVar4 = ref_geom_uv_area(ref_geom,local_a8,&local_c8);
                if (uVar4 != 0) {
                  pcVar10 = "uv area";
                  uVar8 = 0x32d;
                  goto LAB_001fd245;
                }
                uVar4 = ref_geom_uv_area_sign(ref_grid,local_a8[3],&local_d8);
                if (uVar4 != 0) {
                  pcVar10 = "sign";
                  uVar8 = 0x32e;
                  goto LAB_001fd245;
                }
                local_c8 = local_d8 * local_c8;
                if ((local_e0 <= ref_node->min_uv_area) || (local_c8 <= ref_node->min_uv_area)) {
                  *allowed = 0;
                  if (verbose != 0) {
                    printf("area orig %e new %e %e\n",local_e8);
                    ref_node_location(ref_node,node0);
                    ref_node_location(ref_node,node1);
                    return 0;
                  }
                  return 0;
                }
                RVar6 = pRVar1->node_per;
              }
              iVar9 = iVar9 + 1;
            } while (iVar9 < RVar6);
          }
          pRVar3 = pRVar1->ref_adj->item;
          local_c0 = (long)pRVar3[(int)local_c0].next;
          if (local_c0 == -1) break;
          pRVar3 = pRVar3 + local_c0;
        } while( true );
      }
    }
  }
LAB_001fd29a:
  *allowed = 1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_split_edge_tri_conformity(REF_BOOL verbose,
                                                 REF_GRID ref_grid,
                                                 REF_INT node0, REF_INT node1,
                                                 REF_INT new_node,
                                                 REF_BOOL *allowed) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, cell_node;
  REF_INT node;
  REF_DBL sign_uv_area, uv_area0, uv_area1, uv_area;
  REF_DBL normdev, normdev0, normdev1;

  *allowed = REF_FALSE;

  if (0 < ref_geom_n(ref_geom)) {
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
      RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev), "nd");

      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        if (node0 == nodes[node]) nodes[node] = new_node;
      RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev0), "nd0");

      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        if (new_node == nodes[node]) nodes[node] = node0;

      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        if (node1 == nodes[node]) nodes[node] = new_node;
      RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev1), "nd1");

      if ((normdev0 <= normdev &&
           normdev0 < ref_grid_adapt(ref_grid, post_min_normdev)) ||
          (normdev1 <= normdev &&
           normdev1 < ref_grid_adapt(ref_grid, post_min_normdev))) {
        if (verbose) printf("nd %f %f %f\n", normdev, normdev0, normdev1);
        *allowed = REF_FALSE;
        return REF_SUCCESS;
      }
    }
  }

  if (0 < ref_geom_n(ref_geom) && !ref_geom_meshlinked(ref_geom)) {
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
      RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area), "uv area");
      RSS(ref_geom_uv_area_sign(ref_grid, nodes[3], &sign_uv_area), "sign");
      uv_area *= sign_uv_area;

      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        if (node0 == nodes[node]) nodes[node] = new_node;
      RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area0), "uv area");
      RSS(ref_geom_uv_area_sign(ref_grid, nodes[3], &sign_uv_area), "sign");
      uv_area0 *= sign_uv_area;

      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        if (new_node == nodes[node]) nodes[node] = node0;

      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        if (node1 == nodes[node]) nodes[node] = new_node;
      RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area1), "uv area");
      RSS(ref_geom_uv_area_sign(ref_grid, nodes[3], &sign_uv_area), "sign");
      uv_area1 *= sign_uv_area;

      if (ref_node_min_uv_area(ref_node) >= uv_area0 ||
          ref_node_min_uv_area(ref_node) >= uv_area1) {
        *allowed = REF_FALSE;
        if (verbose) {
          printf("area orig %e new %e %e\n", uv_area, uv_area0, uv_area1);
          ref_node_location(ref_node, node0);
          ref_node_location(ref_node, node1);
        }
        return REF_SUCCESS;
      }
    }
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}